

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O2

int __thiscall ncnn::ConvolutionDepthWise::create_pipeline(ConvolutionDepthWise *this,Option *opt)

{
  int iVar1;
  int *piVar2;
  Allocator *pAVar3;
  ulong uVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  size_t sVar8;
  long lVar9;
  Mat local_1a8;
  Mat *local_158;
  Mat local_150;
  Mat local_108;
  Mat local_c0;
  Option opt_q;
  
  if (((opt->use_int8_inference == true) && ((this->weight_data).elemsize == 4)) &&
     (this->int8_scale_term != 0)) {
    local_1a8.cstep = 0;
    local_1a8.data = (void *)0x0;
    local_1a8.refcount._0_4_ = 0;
    local_1a8.refcount._4_4_ = 0;
    local_1a8.elemsize._0_4_ = 0;
    local_1a8.elemsize._4_4_ = 0;
    local_1a8.elempack = 0;
    local_1a8.allocator = (Allocator *)0x0;
    local_1a8.dims = 0;
    local_1a8.w = 0;
    local_1a8.h = 0;
    local_1a8.d = 0;
    local_1a8.c = 0;
    Mat::create(&local_1a8,this->weight_data_size,1,(Allocator *)0x0);
    bVar5 = true;
    if ((local_1a8.data != (void *)0x0) && ((long)local_1a8.c * local_1a8.cstep != 0)) {
      local_158 = &this->weight_data;
      iVar1 = this->group;
      iVar6 = this->weight_data_size / iVar1;
      sVar8 = (size_t)iVar6;
      lVar9 = 0;
      for (lVar7 = 0; lVar7 < iVar1; lVar7 = lVar7 + 1) {
        opt_q.lightmode = opt->lightmode;
        opt_q._1_3_ = *(undefined3 *)&opt->field_0x1;
        opt_q.num_threads = opt->num_threads;
        opt_q.workspace_allocator = opt->workspace_allocator;
        opt_q.openmp_blocktime = opt->openmp_blocktime;
        opt_q.use_winograd_convolution = opt->use_winograd_convolution;
        opt_q.use_sgemm_convolution = opt->use_sgemm_convolution;
        opt_q.use_int8_inference = opt->use_int8_inference;
        opt_q.use_vulkan_compute = opt->use_vulkan_compute;
        uVar4._0_1_ = opt->use_bf16_storage;
        uVar4._1_1_ = opt->use_fp16_packed;
        uVar4._2_1_ = opt->use_fp16_storage;
        uVar4._3_1_ = opt->use_fp16_arithmetic;
        uVar4._4_1_ = opt->use_int8_packed;
        uVar4._5_1_ = opt->use_int8_storage;
        uVar4._6_1_ = opt->use_int8_arithmetic;
        uVar4._7_1_ = opt->use_packing_layout;
        opt_q.use_shader_pack8 = opt->use_shader_pack8;
        opt_q.use_subgroup_basic = opt->use_subgroup_basic;
        opt_q.use_subgroup_vote = opt->use_subgroup_vote;
        opt_q.use_subgroup_ballot = opt->use_subgroup_ballot;
        opt_q.use_subgroup_shuffle = opt->use_subgroup_shuffle;
        opt_q.use_image_storage = opt->use_image_storage;
        opt_q.use_tensor_storage = opt->use_tensor_storage;
        opt_q.use_reserved_0 = opt->use_reserved_0;
        opt_q.flush_denormals = opt->flush_denormals;
        opt_q.use_local_pool_allocator = opt->use_local_pool_allocator;
        opt_q.use_shader_local_memory = opt->use_shader_local_memory;
        opt_q.use_cooperative_matrix = opt->use_cooperative_matrix;
        opt_q.use_winograd23_convolution = opt->use_winograd23_convolution;
        opt_q.use_winograd43_convolution = opt->use_winograd43_convolution;
        opt_q.use_winograd63_convolution = opt->use_winograd63_convolution;
        opt_q.use_reserved_6 = opt->use_reserved_6;
        opt_q.use_reserved_7 = opt->use_reserved_7;
        opt_q.use_reserved_8 = opt->use_reserved_8;
        opt_q.use_reserved_9 = opt->use_reserved_9;
        opt_q.use_reserved_10 = opt->use_reserved_10;
        opt_q.use_reserved_11 = opt->use_reserved_11;
        opt_q.blob_allocator = local_1a8.allocator;
        opt_q._32_8_ = uVar4 & 0xffffffffffffff;
        local_108.elemsize = (this->weight_data).elemsize;
        local_108.data = (void *)(local_108.elemsize * lVar9 + (long)(this->weight_data).data);
        local_108.elempack = (this->weight_data).elempack;
        local_108.allocator = (this->weight_data).allocator;
        local_108.refcount = (int *)0x0;
        local_150.dims = 1;
        local_108.h = 1;
        local_108.d = 1;
        local_150.elemsize = CONCAT44(local_1a8.elemsize._4_4_,(undefined4)local_1a8.elemsize);
        local_150.data = (void *)(local_150.elemsize * lVar9 + (long)local_1a8.data);
        local_150.refcount = (int *)0x0;
        local_150.elempack = local_1a8.elempack;
        local_150.allocator = local_1a8.allocator;
        local_150.h = 1;
        local_150.d = 1;
        local_c0.elemsize = (this->weight_data_int8_scales).elemsize;
        local_c0.data =
             (void *)(local_c0.elemsize * lVar7 + (long)(this->weight_data_int8_scales).data);
        local_c0.elempack = (this->weight_data_int8_scales).elempack;
        local_c0.allocator = (this->weight_data_int8_scales).allocator;
        local_c0.refcount = (int *)0x0;
        local_c0.dims = 1;
        local_c0.w = 1;
        local_c0.h = 1;
        local_c0.d = 1;
        local_c0.cstep = 1;
        local_150.w = iVar6;
        local_150.c = local_150.dims;
        local_150.cstep = sVar8;
        local_108.dims = local_150.dims;
        local_108.w = iVar6;
        local_108.c = local_150.dims;
        local_108.cstep = sVar8;
        local_c0.c = local_150.dims;
        quantize_to_int8(&local_108,&local_150,&local_c0,&opt_q);
        if (local_c0.refcount != (int *)0x0) {
          LOCK();
          *local_c0.refcount = *local_c0.refcount + -1;
          UNLOCK();
          if (*local_c0.refcount == 0) {
            if (local_c0.allocator == (Allocator *)0x0) {
              free(local_c0.data);
            }
            else {
              (*(local_c0.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if (local_150.refcount != (int *)0x0) {
          LOCK();
          *local_150.refcount = *local_150.refcount + -1;
          UNLOCK();
          if (*local_150.refcount == 0) {
            if (local_150.allocator == (Allocator *)0x0) {
              free(local_150.data);
            }
            else {
              (*(local_150.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if (local_108.refcount != (int *)0x0) {
          LOCK();
          *local_108.refcount = *local_108.refcount + -1;
          UNLOCK();
          if (*local_108.refcount == 0) {
            if (local_108.allocator == (Allocator *)0x0) {
              free(local_108.data);
            }
            else {
              (*(local_108.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar1 = this->group;
        lVar9 = lVar9 + sVar8;
      }
      if (local_158 != &local_1a8) {
        piVar2 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        piVar2 = (this->weight_data).refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            pAVar3 = (this->weight_data).allocator;
            if (pAVar3 == (Allocator *)0x0) {
              free((this->weight_data).data);
            }
            else {
              (*pAVar3->_vptr_Allocator[3])();
            }
          }
        }
        (this->weight_data).data = local_1a8.data;
        (this->weight_data).refcount =
             (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
        (this->weight_data).elemsize =
             CONCAT44(local_1a8.elemsize._4_4_,(undefined4)local_1a8.elemsize);
        (this->weight_data).elempack = local_1a8.elempack;
        (this->weight_data).allocator = local_1a8.allocator;
        (this->weight_data).dims = local_1a8.dims;
        (this->weight_data).w = local_1a8.w;
        (this->weight_data).h = local_1a8.h;
        (this->weight_data).d = local_1a8.d;
        (this->weight_data).c = local_1a8.c;
        (this->weight_data).cstep = local_1a8.cstep;
      }
      bVar5 = false;
    }
    piVar2 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_1a8.allocator == (Allocator *)0x0) {
          free(local_1a8.data);
        }
        else {
          (*(local_1a8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (bVar5) {
      return -100;
    }
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise::create_pipeline(const Option& opt)
{
#if NCNN_INT8
    // runtime quantize the weight data
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)4u && int8_scale_term)
    {
        Mat int8_weight_data(weight_data_size, (size_t)1u);
        if (int8_weight_data.empty())
            return -100;

        const int weight_data_size_g = weight_data_size / group;

        for (int g = 0; g < group; g++)
        {
            Option opt_q = opt;
            opt_q.blob_allocator = int8_weight_data.allocator;
            opt_q.use_packing_layout = false;

            const Mat weight_data_g = weight_data.range(weight_data_size_g * g, weight_data_size_g);
            Mat int8_weight_data_g = int8_weight_data.range(weight_data_size_g * g, weight_data_size_g);
            const Mat weight_data_int8_scales_g = weight_data_int8_scales.range(g, 1);
            quantize_to_int8(weight_data_g, int8_weight_data_g, weight_data_int8_scales_g, opt_q);
        }

        weight_data = int8_weight_data;
    }
#else
    (void)(opt);
#endif // NCNN_INT8

    return 0;
}